

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O2

void __thiscall fasttext::Dictionary::Dictionary(Dictionary *this,shared_ptr<fasttext::Args> *args)

{
  pointer piVar1;
  pointer piVar2;
  pointer piVar3;
  long lVar4;
  undefined1 auVar5 [32];
  
  auVar5 = ZEXT1632(ZEXT816(0) << 0x40);
  *(undefined1 (*) [32])
   &(this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
    super__Vector_impl_data._M_finish = auVar5;
  this->m2int_ = (vector<int,_std::allocator<int>_>)auVar5._0_24_;
  (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar5._24_8_;
  auVar5 = ZEXT1632(ZEXT816(0) << 0x40);
  *(undefined1 (*) [32])
   &(this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = auVar5;
  this->args_ = (shared_ptr<fasttext::Args>)auVar5._0_16_;
  (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)auVar5._16_8_;
  (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)auVar5._24_8_;
  (this->pdiscard_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2> *)this,
             &args->super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>);
  this->ntokens_ = 0;
  this->size_ = 0;
  this->lsize_ = 0;
  this->msize_ = 0;
  this->nwords_ = 0;
  this->nlabels_ = 0;
  std::vector<int,_std::allocator<int>_>::resize(&this->word2int_,30000000);
  std::vector<int,_std::allocator<int>_>::resize(&this->l2int_,30000000);
  std::vector<int,_std::allocator<int>_>::resize(&this->m2int_,30000000);
  piVar1 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->l2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->m2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar4 = 0; lVar4 != 30000000; lVar4 = lVar4 + 1) {
    piVar1[lVar4] = -1;
    piVar2[lVar4] = -1;
    piVar3[lVar4] = -1;
  }
  return;
}

Assistant:

Dictionary::Dictionary(std::shared_ptr<Args> args) {
  args_ = args;
  size_ = 0;
  lsize_ = 0;
  msize_ = 0;
  nwords_ = 0;
  nlabels_ = 0;
  ntokens_ = 0;
  word2int_.resize(MAX_VOCAB_SIZE);
  l2int_.resize(MAX_VOCAB_SIZE);
  m2int_.resize(MAX_VOCAB_SIZE);
  for (int32_t i = 0; i < MAX_VOCAB_SIZE; i++) {
    word2int_[i] = -1;
    l2int_[i] = -1;
    m2int_[i] = -1;
  }
}